

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

bool __thiscall
cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
iterator::operator==(iterator *this,iterator other)

{
  size_type sVar1;
  size_type sVar2;
  iterator *this_local;
  iterator other_local;
  
  if (this->Tree ==
      (cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    __assert_fail("this->Tree",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLinkedTree.h"
                  ,0x66,
                  "bool cmLinkedTree<std::basic_string<char>>::iterator::operator==(iterator) const [T = std::basic_string<char>]"
                 );
  }
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->Tree->UpPositions)
  ;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->Tree->Data);
  if (sVar1 == sVar2) {
    if (this->Tree == other.Tree) {
      return this->Position == other.Position;
    }
    __assert_fail("this->Tree == other.Tree",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLinkedTree.h"
                  ,0x68,
                  "bool cmLinkedTree<std::basic_string<char>>::iterator::operator==(iterator) const [T = std::basic_string<char>]"
                 );
  }
  __assert_fail("this->Tree->UpPositions.size() == this->Tree->Data.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLinkedTree.h"
                ,0x67,
                "bool cmLinkedTree<std::basic_string<char>>::iterator::operator==(iterator) const [T = std::basic_string<char>]"
               );
}

Assistant:

bool operator==(iterator other) const
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Tree == other.Tree);
      return this->Position == other.Position;
    }